

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,_Bool noexpire,char *lineptr
                        ,char *domain,char *path,_Bool secure)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  _Bool _Var5;
  _Bool _Var6;
  int iVar7;
  CURLofft CVar8;
  time_t tVar9;
  Cookie *co;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  curl_off_t cVar13;
  Cookie *pCVar14;
  Cookie *pCVar15;
  char *pcVar16;
  size_t max;
  time_t tVar17;
  undefined7 in_register_00000009;
  long lVar18;
  uint uVar19;
  curl_off_t *num;
  Cookie *pCVar20;
  char *pcVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  char *local_2060;
  undefined8 local_2040;
  char what [4096];
  char name [4096];
  
  bVar24 = 0;
  local_2040 = CONCAT44(local_2040._4_4_,(int)CONCAT71(in_register_00000009,noexpire));
  tVar9 = time((time_t *)0x0);
  co = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (co == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  local_2060 = domain;
  if (httpheader) {
    sVar10 = strlen(lineptr);
    if (5000 < sVar10) {
LAB_0010dde2:
      (*Curl_cfree)(co);
      return (Cookie *)0x0;
    }
    pcVar11 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    bVar23 = false;
LAB_0010de0e:
    what[0] = '\0';
    name._0_8_ = name._0_8_ & 0xffffffffffffff00;
    iVar7 = __isoc99_sscanf(lineptr,"%4095[^;\r\n=] =%4095[^;\r\n]",name,what);
    if (iVar7 < 1) goto LAB_0010e006;
    sVar10 = strlen(what);
    sVar12 = strlen(name);
    if (((0xffe < sVar12) || (0xffe < sVar10)) || (0x1000 < sVar12 + sVar10)) {
      freecookie(co);
      Curl_infof(data,"oversized cookie dropped, name/val %zu + %zu bytes\n",sVar12,sVar10);
      return (Cookie *)0x0;
    }
    cVar1 = lineptr[sVar12];
    if ((sVar12 != 0) && ((cVar4 = lineptr[sVar12 - 1], cVar4 == ' ' || (cVar4 == '\t')))) {
LAB_0010de92:
      if (cVar4 != ' ') {
        if (((cVar4 == '\0') || (cVar4 != '\t')) || (sVar12 == 0)) goto LAB_0010deb9;
LAB_0010dead:
        cVar4 = lineptr[sVar12 - 2];
        sVar12 = sVar12 - 1;
        goto LAB_0010de92;
      }
      if (sVar12 != 0) goto LAB_0010dead;
      sVar12 = 0;
LAB_0010deb9:
      name[sVar12] = '\0';
    }
    bVar2 = true;
    for (; sVar10 != 0; sVar10 = sVar10 - 1) {
      if ((what[sVar10 - 1] != ' ') && (what[sVar10 - 1] != '\t')) {
        bVar2 = false;
        break;
      }
      what[sVar10 - 1] = '\0';
    }
    for (pcVar21 = what; (*pcVar21 == ' ' || (*pcVar21 == '\t')); pcVar21 = pcVar21 + 1) {
    }
    if (co->name == (char *)0x0) {
      bVar2 = true;
      if (cVar1 != '=') goto LAB_0010e4ab;
      pcVar16 = (*Curl_cstrdup)(name);
      co->name = pcVar16;
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->value = pcVar21;
      if (co->name == (char *)0x0) goto LAB_0010e4ab;
LAB_0010dffd:
      bVar2 = true;
      if (pcVar21 == (char *)0x0) goto LAB_0010e4ab;
LAB_0010e006:
      bVar2 = bVar23;
      if ((pcVar11 == (char *)0x0) || (lineptr = pcVar11, *pcVar11 == '\0')) goto LAB_0010e4ab;
      do {
        do {
          lineptr = lineptr + 1;
          cVar1 = *lineptr;
        } while (cVar1 == ' ');
      } while (cVar1 == '\t');
      pcVar11 = strchr(lineptr,0x3b);
      bVar23 = bVar2;
      if (pcVar11 == (char *)0x0) {
        if (cVar1 == '\0') goto LAB_0010e4ab;
        sVar10 = strlen(lineptr);
        pcVar11 = lineptr + sVar10;
      }
      goto LAB_0010de0e;
    }
    if (bVar2) {
      iVar7 = Curl_strcasecompare("secure",name);
      if (iVar7 == 0) {
        iVar7 = Curl_strcasecompare("httponly",name);
        if (iVar7 == 0) {
          if (cVar1 == '=') goto LAB_0010dfac;
        }
        else {
          co->httponly = true;
        }
      }
      else {
        if ((!secure) && (c->running != false)) goto LAB_0010e8d2;
        co->secure = true;
      }
      goto LAB_0010e006;
    }
LAB_0010dfac:
    iVar7 = Curl_strcasecompare("path",name);
    if (iVar7 != 0) {
      (*Curl_cfree)(co->path);
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->path = pcVar21;
      bVar2 = true;
      if (pcVar21 != (char *)0x0) {
        (*Curl_cfree)(co->spath);
        pcVar21 = sanitize_cookie_path(co->path);
        co->spath = pcVar21;
        goto LAB_0010dffd;
      }
      goto LAB_0010e4ab;
    }
    iVar7 = Curl_strcasecompare("domain",name);
    if (iVar7 == 0) {
      iVar7 = Curl_strcasecompare("version",name);
      if (iVar7 == 0) {
        iVar7 = Curl_strcasecompare("max-age",name);
        if (iVar7 != 0) {
          (*Curl_cfree)(co->maxage);
          pcVar21 = (*Curl_cstrdup)(pcVar21);
          co->maxage = pcVar21;
          if (pcVar21 != (char *)0x0) goto LAB_0010e006;
          bVar2 = true;
          goto LAB_0010e936;
        }
        iVar7 = Curl_strcasecompare("expires",name);
        if (iVar7 != 0) {
          (*Curl_cfree)(co->expirestr);
          pcVar21 = (*Curl_cstrdup)(pcVar21);
          co->expirestr = pcVar21;
          goto LAB_0010e159;
        }
        goto LAB_0010e006;
      }
      (*Curl_cfree)(co->version);
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->version = pcVar21;
    }
    else {
      pcVar21 = pcVar21 + (*pcVar21 == '.');
      _Var6 = bad_domain(pcVar21);
      if (_Var6) {
        local_2060 = ":";
      }
      pcVar16 = local_2060;
      if (local_2060 == (char *)0x0) {
        pcVar16 = pcVar21;
      }
      _Var6 = isip(pcVar16);
      if (local_2060 != (char *)0x0) {
        if (_Var6) {
          iVar7 = strcmp(pcVar21,local_2060);
          if (iVar7 != 0) {
LAB_0010e0d6:
            Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar21);
            bVar23 = true;
            goto LAB_0010e006;
          }
        }
        else {
          _Var5 = tailmatch(pcVar21,local_2060);
          if (!_Var5) goto LAB_0010e0d6;
        }
      }
      (*Curl_cfree)(co->domain);
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      co->domain = pcVar21;
      if (pcVar21 != (char *)0x0 && !_Var6) {
        co->tailmatch = true;
        goto LAB_0010e006;
      }
    }
LAB_0010e159:
    if (pcVar21 != (char *)0x0) goto LAB_0010e006;
LAB_0010e8d2:
    bVar2 = true;
LAB_0010e4ab:
    pcVar11 = co->maxage;
    if (pcVar11 == (char *)0x0) {
LAB_0010e936:
      if (co->expirestr != (char *)0x0) {
        tVar17 = curl_getdate(co->expirestr,(time_t *)0x0);
        co->expires = tVar17;
        if (tVar17 == 0) {
          co->expires = 1;
        }
        else if (tVar17 < 0) {
          co->expires = 0;
        }
      }
    }
    else {
      num = &co->expires;
      CVar8 = curlx_strtoofft(pcVar11 + (*pcVar11 == '\"'),(char **)0x0,10,num);
      if (CVar8 == CURL_OFFT_OK) {
        lVar18 = *num;
        if (lVar18 == 0) {
          *num = 1;
        }
        else {
          if (lVar18 <= 0x7fffffffffffffff - tVar9) {
            cVar13 = lVar18 + tVar9;
            goto LAB_0010e54c;
          }
          *num = 0x7fffffffffffffff;
        }
      }
      else if (CVar8 == CURL_OFFT_FLOW) {
        cVar13 = 0x7fffffffffffffff;
LAB_0010e54c:
        *num = cVar13;
      }
    }
    bVar23 = bVar2;
    if (((!bVar2) && (co->domain == (char *)0x0)) && (local_2060 != (char *)0x0)) {
      pcVar11 = (*Curl_cstrdup)(local_2060);
      co->domain = pcVar11;
      bVar23 = true;
      if (pcVar11 != (char *)0x0) {
        bVar23 = bVar2;
      }
    }
    if (((!bVar23) && (path != (char *)0x0)) && (co->path == (char *)0x0)) {
      pcVar11 = strchr(path,0x3f);
      if (pcVar11 == (char *)0x0) {
        pcVar11 = strrchr(path,0x2f);
      }
      else {
        pcVar11 = (char *)Curl_memrchr(path,0x2f,(long)pcVar11 - (long)path);
      }
      if (pcVar11 != (char *)0x0) {
        pcVar21 = (char *)(*Curl_cmalloc)((size_t)(pcVar11 + (2 - (long)path)));
        co->path = pcVar21;
        if (pcVar21 == (char *)0x0) goto LAB_0010e910;
        memcpy(pcVar21,path,(size_t)(pcVar11 + (1 - (long)path)));
        co->path[(long)(pcVar11 + (1 - (long)path))] = '\0';
        pcVar11 = sanitize_cookie_path(co->path);
        co->spath = pcVar11;
        bVar23 = pcVar11 == (char *)0x0;
      }
    }
    if ((bVar23) || (co->name == (char *)0x0)) goto LAB_0010e910;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar7 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar7 == 0) {
      lineptr = lineptr + 10;
      co->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0010dde2;
    pcVar11 = strchr(lineptr,0xd);
    if (pcVar11 != (char *)0x0) {
      *pcVar11 = '\0';
    }
    pcVar11 = strchr(lineptr,10);
    if (pcVar11 != (char *)0x0) {
      *pcVar11 = '\0';
    }
    pcVar11 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar11 == (char *)0x0) goto LAB_0010e910;
    uVar19 = 0;
    bVar2 = false;
    bVar23 = false;
    do {
      bVar22 = bVar2;
      switch(uVar19) {
      case 0:
        pcVar11 = (*Curl_cstrdup)(pcVar11 + (*pcVar11 == '.'));
        co->domain = pcVar11;
        uVar19 = 0;
        uVar3 = 0;
        if (pcVar11 == (char *)0x0) {
LAB_0010e427:
          uVar19 = uVar3;
          bVar23 = true;
          bVar22 = true;
        }
        else {
          _Var6 = bad_domain(pcVar11);
          bVar23 = true;
          bVar22 = true;
          if (!_Var6) {
            bVar23 = bVar2;
            bVar22 = bVar2;
          }
        }
        break;
      case 1:
        iVar7 = Curl_strcasecompare(pcVar11,"TRUE");
        co->tailmatch = iVar7 != 0;
        uVar19 = 1;
        break;
      case 2:
        iVar7 = strcmp("TRUE",pcVar11);
        if ((iVar7 == 0) || (iVar7 = strcmp("FALSE",pcVar11), iVar7 == 0)) {
          pcVar21 = (*Curl_cstrdup)("/");
          co->path = pcVar21;
          pcVar16 = (*Curl_cstrdup)("/");
          if (pcVar21 == (char *)0x0) {
            bVar2 = true;
          }
          co->spath = pcVar16;
          bVar23 = bVar2;
          if (pcVar16 == (char *)0x0) {
            bVar2 = true;
            bVar23 = true;
          }
          goto switchD_0010e26b_caseD_3;
        }
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        co->path = pcVar11;
        uVar19 = 2;
        uVar3 = 2;
        if (pcVar11 == (char *)0x0) goto LAB_0010e427;
        pcVar11 = sanitize_cookie_path(pcVar11);
        co->spath = pcVar11;
        bVar23 = bVar2;
        if (pcVar11 == (char *)0x0) {
          bVar23 = true;
          bVar22 = true;
        }
        break;
      case 3:
switchD_0010e26b_caseD_3:
        co->secure = false;
        iVar7 = Curl_strcasecompare(pcVar11,"TRUE");
        uVar19 = 3;
        bVar22 = bVar2;
        if (iVar7 != 0) {
          if ((!secure) && (uVar3 = 3, c->running != true)) goto LAB_0010e427;
          co->secure = true;
        }
        break;
      case 4:
        CVar8 = curlx_strtoofft(pcVar11,(char **)0x0,10,&co->expires);
        if (CVar8 != CURL_OFFT_OK) {
          bVar2 = true;
        }
        uVar19 = 4;
        bVar23 = bVar2;
        bVar22 = bVar2;
        break;
      case 5:
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        co->name = pcVar11;
        if (pcVar11 == (char *)0x0) {
          bVar2 = true;
        }
        uVar19 = 5;
        bVar23 = bVar2;
        bVar22 = bVar2;
        break;
      case 6:
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        co->value = pcVar11;
        if (pcVar11 == (char *)0x0) {
          bVar2 = true;
        }
        uVar19 = 6;
        bVar23 = bVar2;
        bVar22 = bVar2;
      }
      bVar2 = bVar22;
      pcVar11 = strtok_r((char *)0x0,"\t",(char **)name);
      uVar19 = uVar19 + 1;
    } while ((pcVar11 != (char *)0x0) && (!bVar23));
    if (uVar19 == 6) {
      pcVar11 = (*Curl_cstrdup)("");
      co->value = pcVar11;
      bVar2 = true;
      if (pcVar11 != (char *)0x0) {
        bVar2 = bVar23;
      }
      bVar23 = bVar2;
      uVar19 = pcVar11 == (char *)0x0 ^ 7;
    }
    if ((bVar23) || (uVar19 != 7)) goto LAB_0010e910;
  }
  if ((c->running != false) || ((c->newsession != true || (co->expires != 0)))) {
    co->livecookie = c->running;
    iVar7 = c->lastct + 1;
    c->lastct = iVar7;
    co->creationtime = iVar7;
    if ((char)local_2040 == '\0') {
      remove_expired(c);
    }
    if ((((local_2060 != (char *)0x0) && (co->domain != (char *)0x0)) &&
        (_Var6 = isip(co->domain), !_Var6)) && (_Var6 = bad_domain(co->domain), _Var6)) {
      Curl_infof(data,"cookie \'%s\' dropped, domain \'%s\' must not set cookies for \'%s\'\n",
                 co->name,local_2060,co->domain);
      freecookie(co);
      return (Cookie *)0x0;
    }
    local_2040 = cookiehash(co->domain);
    bVar2 = false;
    bVar23 = false;
    if (c->cookies[local_2040] == (Cookie *)0x0) {
      pCVar20 = (Cookie *)0x0;
    }
    else {
      pCVar15 = c->cookies[local_2040];
      do {
        pCVar14 = pCVar15;
        iVar7 = Curl_strcasecompare(pCVar14->name,co->name);
        if (iVar7 != 0) {
          pcVar11 = co->domain;
          if (pCVar14->domain == (char *)0x0) {
            bVar22 = pcVar11 == (char *)0x0;
LAB_0010e6aa:
            bVar23 = bVar2;
            if (bVar22) {
              bVar2 = true;
              bVar23 = true;
            }
          }
          else if ((pcVar11 != (char *)0x0) &&
                  (iVar7 = Curl_strcasecompare(pCVar14->domain,pcVar11), iVar7 != 0)) {
            bVar22 = pCVar14->tailmatch == co->tailmatch;
            goto LAB_0010e6aa;
          }
          if (bVar23) {
            pcVar11 = pCVar14->spath;
            pcVar21 = co->spath;
            if (pcVar11 == (char *)0x0) {
              if (pcVar21 == (char *)0x0) {
LAB_0010e84b:
                bVar23 = true;
LAB_0010e84e:
                if ((co->livecookie != false) || (pCVar14->livecookie != true)) {
                  co->next = pCVar14->next;
                  co->creationtime = pCVar14->creationtime;
                  (*Curl_cfree)(pCVar14->name);
                  (*Curl_cfree)(pCVar14->value);
                  (*Curl_cfree)(pCVar14->domain);
                  (*Curl_cfree)(pCVar14->path);
                  (*Curl_cfree)(pCVar14->spath);
                  (*Curl_cfree)(pCVar14->expirestr);
                  (*Curl_cfree)(pCVar14->version);
                  (*Curl_cfree)(pCVar14->maxage);
                  pCVar15 = co;
                  pCVar20 = pCVar14;
                  for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
                    pCVar20->next = pCVar15->next;
                    pCVar15 = (Cookie *)((long)pCVar15 + (ulong)bVar24 * -0x10 + 8);
                    pCVar20 = (Cookie *)((long)pCVar20 + (ulong)bVar24 * -0x10 + 8);
                  }
                  (*Curl_cfree)(co);
                  pCVar15 = pCVar14;
                  do {
                    pCVar20 = pCVar15;
                    pCVar15 = pCVar20->next;
                    co = pCVar14;
                  } while (pCVar15 != (Cookie *)0x0);
                  break;
                }
                goto LAB_0010e910;
              }
            }
            else if (pcVar21 != (char *)0x0) {
              if ((pCVar14->secure == true) && (co->secure == false && !secure)) {
                pcVar16 = strchr(pcVar11 + 1,0x2f);
                if (pcVar16 == (char *)0x0) {
                  max = strlen(pcVar11);
                }
                else {
                  max = (long)pcVar16 - (long)pcVar11;
                }
                iVar7 = Curl_strncasecompare(pcVar11,pcVar21,max);
                if (iVar7 == 0) goto LAB_0010e84e;
                goto LAB_0010e910;
              }
              iVar7 = Curl_strcasecompare(pcVar11,pcVar21);
              if (iVar7 != 0) goto LAB_0010e84b;
            }
            bVar2 = false;
            bVar23 = false;
          }
        }
        pCVar15 = pCVar14->next;
        pCVar20 = pCVar14;
      } while (pCVar14->next != (Cookie *)0x0);
    }
    if (c->running != false) {
      pcVar11 = "Added";
      if (bVar23) {
        pcVar11 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar11,co->name,
                 co->value,co->domain,co->path,co->expires);
    }
    if (!bVar23) {
      pCVar15 = (Cookie *)(c->cookies + local_2040);
      if (pCVar20 != (Cookie *)0x0) {
        pCVar15 = pCVar20;
      }
      pCVar15->next = co;
      c->numcookies = c->numcookies + 1;
      return co;
    }
    return co;
  }
LAB_0010e910:
  freecookie(co);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */
  size_t myhash;

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %zu + %zu bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name) {
          /* The very first name/value pair is the actual cookie name */
          if(!sep) {
            /* Bad name/value pair. */
            badcookie = TRUE;
            break;
          }
          co->name = strdup(name);
          co->value = strdup(whatptr);
          done = TRUE;
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          /*
           * secure cookies are only allowed to be set when the connection is
           * using a secure protocol, or when the cookie is being set by
           * reading from file
           */
          if(strcasecompare("secure", name)) {
            if(secure || !c->running) {
              co->secure = TRUE;
            }
            else {
              badcookie = TRUE;
              break;
            }
          }
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          if(bad_domain(whatptr))
            domain = ":";
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(!co->expires)
          /* already expired */
          co->expires = 1;
        else if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (queryp - path));
      if(endslash) {
        size_t pathlen = (endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        else if(bad_domain(co->domain))
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = FALSE;
        if(strcasecompare(ptr, "TRUE")) {
          if(secure || c->running)
            co->secure = TRUE;
          else
            badcookie = TRUE;
        }
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;
  co->creationtime = ++c->lastct;

  /* now, we have parsed the incoming line, we must now check if this
     supersedes an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  if(!noexpire)
    remove_expired(c);

  if(domain && co->domain && !isip(co->domain)) {
    int acceptable;
#ifdef USE_LIBPSL
    const psl_ctx_t *psl = Curl_psl_use(data);

    /* Check if the domain is a Public Suffix and if yes, ignore the cookie. */
    if(psl) {
      acceptable = psl_is_cookie_domain_acceptable(psl, domain, co->domain);
      Curl_psl_release(data);
    }
    else
#endif
    /* Without libpsl, do the best we can. */
    acceptable = !bad_domain(co->domain);

    if(!acceptable) {
      infof(data, "cookie '%s' dropped, domain '%s' must not "
                  "set cookies for '%s'\n", co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }

  myhash = cookiehash(co->domain);
  clist = c->cookies[myhash];
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(clist->secure && !co->secure && !secure) {
            size_t cllen;
            const char *sep;

            /*
             * A non-secure cookie may not overlay an existing secure cookie.
             * For an existing cookie "a" with path "/login", refuse a new
             * cookie "a" with for example path "/login/en", while the path
             * "/loginhelper" is ok.
             */

            sep = strchr(clist->spath + 1, '/');

            if(sep)
              cllen = sep - clist->spath;
            else
              cllen = strlen(clist->spath);

            if(strncasecompare(clist->spath, co->spath, cllen)) {
              freecookie(co);
              return NULL;
            }
          }
          else if(strcasecompare(clist->spath, co->spath))
            replace_old = TRUE;
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* when replacing, creationtime is kept from old */
        co->creationtime = clist->creationtime;

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies[myhash] = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}